

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int div_ab(em8051 *aCPU)

{
  byte bVar1;
  byte local_18;
  int res;
  int b;
  int a;
  em8051 *aCPU_local;
  
  res._0_1_ = aCPU->mSFR[0x60];
  bVar1 = aCPU->mSFR[0x70];
  aCPU->mSFR[0x50] = aCPU->mSFR[0x50] & 0x7b;
  if (bVar1 == 0) {
    aCPU->mSFR[0x50] = aCPU->mSFR[0x50] | 4;
    local_18 = 0;
  }
  else {
    local_18 = (byte)res % bVar1;
    res._0_1_ = (byte)res / bVar1;
  }
  aCPU->mSFR[0x60] = (byte)res;
  aCPU->mSFR[0x70] = local_18;
  aCPU->mPC = aCPU->mPC + 1;
  return 3;
}

Assistant:

static int div_ab(struct em8051 *aCPU)
{
    int a = ACC;
    int b = aCPU->mSFR[REG_B];
    int res;
    PSW &= ~(PSWMASK_C|PSWMASK_OV);
    if (b)
    {
        res = a/b;
        b = a % b;
        a = res;
    }
    else
    {
        PSW |= PSWMASK_OV;
    }
    ACC = a;
    aCPU->mSFR[REG_B] = b;
    PC++;
    return 3;
}